

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileBacktrace __thiscall cmMakefile::GetBacktrace(cmMakefile *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  cmListFileBacktrace cVar1;
  cmMakefile *this_local;
  
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)this,(cmListFileBacktrace *)(in_RSI + 0x2e8));
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar1.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace() const
{
  return this->Backtrace;
}